

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFontGlyph * __thiscall ImFont::FindGlyph(ImFont *this,ImWchar c)

{
  value_type_conflict4 *pvVar1;
  unsigned_short i;
  ImWchar c_local;
  ImFont *this_local;
  
  if ((int)(uint)c < (this->IndexLookup).Size) {
    pvVar1 = ImVector<unsigned_short>::operator[](&this->IndexLookup,(uint)c);
    if (*pvVar1 == 0xffff) {
      this_local = (ImFont *)this->FallbackGlyph;
    }
    else {
      this_local = (ImFont *)((this->Glyphs).Data + *pvVar1);
    }
  }
  else {
    this_local = (ImFont *)this->FallbackGlyph;
  }
  return (ImFontGlyph *)this_local;
}

Assistant:

const ImFontGlyph* ImFont::FindGlyph(ImWchar c) const
{
    if (c >= IndexLookup.Size)
        return FallbackGlyph;
    const unsigned short i = IndexLookup[c];
    if (i == (unsigned short)-1)
        return FallbackGlyph;
    return &Glyphs.Data[i];
}